

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  bool bVar1;
  int iVar2;
  object local_78;
  PyObject *local_70;
  char *local_68;
  object local_60;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_58 [8]
  ;
  handle local_50;
  handle local_48;
  object local_40;
  handle local_38;
  
  cpp_function::name((cpp_function *)&local_38);
  local_50.m_ptr = (cls->super_handle).m_ptr;
  if (local_38.m_ptr != (PyObject *)0x0) {
    (local_38.m_ptr)->ob_refcnt = (local_38.m_ptr)->ob_refcnt + 1;
  }
  local_48.m_ptr = local_38.m_ptr;
  local_78.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_40.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object(&local_78);
  accessor_policies::obj_attr::set
            (local_50,local_48,(cf->super_function).super_object.super_handle.m_ptr);
  object::~object(&local_40);
  object::~object((object *)&local_48);
  object::~object((object *)&local_38);
  iVar2 = strcmp(name_,"__eq__");
  if (iVar2 == 0) {
    local_50.m_ptr = (cls->super_handle).m_ptr;
    local_48.m_ptr = (PyObject *)0x400b1f;
    local_40.super_handle.m_ptr = (handle)(PyObject *)0x0;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>(local_58,(char (*) [9])"__hash__");
    bVar1 = !bVar1;
    object::~object(&local_40);
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_38.m_ptr = (PyObject *)&_Py_NoneStruct;
    local_70 = (cls->super_handle).m_ptr;
    local_68 = "__hash__";
    local_60.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_70,"__hash__",(PyObject *)&_Py_NoneStruct);
    object::~object(&local_60);
    object::~object((object *)&local_38);
  }
  return;
}

Assistant:

inline void add_class_method(object& cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
      cls.attr("__hash__") = none();
    }
}